

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::EnsureDirectoryExists(cmNinjaTargetGenerator *this,string *path)

{
  bool bVar1;
  cmake *this_00;
  string *psVar2;
  undefined1 local_40 [8];
  string fullPath;
  cmGlobalNinjaGenerator *gg;
  string *path_local;
  cmNinjaTargetGenerator *this_local;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  if (bVar1) {
    cmsys::SystemTools::MakeDirectory(path,(mode_t *)0x0);
  }
  else {
    fullPath.field_2._8_8_ = GetGlobalGenerator(this);
    this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)fullPath.field_2._8_8_);
    psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)local_40,(string *)psVar2);
    cmGlobalNinjaGenerator::StripNinjaOutputPathPrefixAsSuffix
              ((cmGlobalNinjaGenerator *)fullPath.field_2._8_8_,(string *)local_40);
    std::__cxx11::string::operator+=((string *)local_40,(string *)path);
    cmsys::SystemTools::MakeDirectory((string *)local_40,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::EnsureDirectoryExists(
  const std::string& path) const
{
  if (cmSystemTools::FileIsFullPath(path)) {
    cmSystemTools::MakeDirectory(path);
  } else {
    cmGlobalNinjaGenerator* gg = this->GetGlobalGenerator();
    std::string fullPath = gg->GetCMakeInstance()->GetHomeOutputDirectory();
    // Also ensures their is a trailing slash.
    gg->StripNinjaOutputPathPrefixAsSuffix(fullPath);
    fullPath += path;
    cmSystemTools::MakeDirectory(fullPath);
  }
}